

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

LogLevel sznet::initLogLevel(void)

{
  char *pcVar1;
  LogLevel local_c;
  
  pcVar1 = getenv("SZNET_LOG_TRACE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("SZNET_LOG_DEBUG");
    if (pcVar1 == (char *)0x0) {
      local_c = INFO;
    }
    else {
      local_c = DEBUG;
    }
  }
  else {
    local_c = TRACE;
  }
  return local_c;
}

Assistant:

Logger::LogLevel initLogLevel()
{
	if (::getenv("SZNET_LOG_TRACE"))
	{
		return Logger::TRACE;
	}
	else if (::getenv("SZNET_LOG_DEBUG"))
	{
		return Logger::DEBUG;
	}
	else
	{
		return Logger::INFO;
	}
}